

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-mmsg.c
# Opt level: O3

int run_test_udp_mmsg(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar9;
  void *pvVar10;
  long lVar11;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_udp_t *puVar12;
  uv_udp_t *handle;
  ulong in_R8;
  char *unaff_R12;
  void *unaff_R13;
  uv_udp_t *unaff_R14;
  int64_t eval_b;
  int64_t eval_b_6;
  int64_t eval_a;
  sockaddr_in addr;
  undefined1 local_50 [16];
  uv_buf_t local_40;
  sockaddr_in local_30;
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_40.base;
  local_40 = (uv_buf_t)(auVar6 << 0x40);
  iVar7 = uv_ip4_addr("0.0.0.0",0x23a3,&local_30);
  local_50._0_8_ = SEXT48(iVar7);
  if (local_40.base == (char *)local_50._0_8_) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_40.len;
    local_40 = (uv_buf_t)(auVar1 << 0x40);
    puVar9 = uv_default_loop();
    iVar7 = uv_udp_init_ex(puVar9,&recver,0x100);
    local_50._0_8_ = SEXT48(iVar7);
    if (local_40.base != (char *)local_50._0_8_) goto LAB_00185b9c;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_40.len;
    local_40 = (uv_buf_t)(auVar2 << 0x40);
    iVar7 = uv_udp_bind(&recver,(sockaddr *)&local_30,0);
    local_50._0_8_ = SEXT48(iVar7);
    if (local_40.base != (char *)local_50._0_8_) goto LAB_00185bab;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_40.len;
    local_40 = (uv_buf_t)(auVar3 << 0x40);
    iVar7 = uv_udp_recv_start(&recver,alloc_cb,recv_cb);
    local_50._0_8_ = SEXT48(iVar7);
    if (local_40.base != (char *)local_50._0_8_) goto LAB_00185bba;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_40.len;
    local_40 = (uv_buf_t)(auVar4 << 0x40);
    iVar7 = uv_ip4_addr("127.0.0.1",0x23a3,&local_30);
    local_50._0_8_ = SEXT48(iVar7);
    if (local_40.base != (char *)local_50._0_8_) goto LAB_00185bc9;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_40.len;
    local_40 = (uv_buf_t)(auVar5 << 0x40);
    puVar9 = uv_default_loop();
    iVar7 = uv_udp_init(puVar9,&sender);
    local_50._0_8_ = SEXT48(iVar7);
    if (local_40.base != (char *)local_50._0_8_) goto LAB_00185bd8;
    local_40 = uv_buf_init("PING",4);
    iVar7 = 8;
    unaff_R14 = &sender;
    do {
      local_50._0_8_ = (uv_loop_t *)0x4;
      iVar8 = uv_udp_try_send(&sender,&local_40,1,(sockaddr *)&local_30);
      local_50._8_8_ = SEXT48(iVar8);
      if (local_50._0_8_ != local_50._8_8_) {
        run_test_udp_mmsg_cold_7();
        goto LAB_00185b8d;
      }
      iVar7 = iVar7 + -1;
    } while (iVar7 != 0);
    local_50._0_8_ = (uv_loop_t *)0x0;
    puVar9 = uv_default_loop();
    iVar7 = uv_run(puVar9,UV_RUN_DEFAULT);
    local_50._8_8_ = SEXT48(iVar7);
    if (local_50._0_8_ != local_50._8_8_) goto LAB_00185be7;
    local_50._0_8_ = SEXT48(close_cb_called);
    local_50._8_8_ = (uv_loop_t *)0x2;
    if ((uv_loop_t *)local_50._0_8_ != (uv_loop_t *)0x2) goto LAB_00185bf6;
    local_50._0_8_ = SEXT48(recv_cb_called);
    local_50._8_8_ = (uv_loop_t *)0x8;
    if ((uv_loop_t *)local_50._0_8_ != (uv_loop_t *)0x8) goto LAB_00185c05;
    local_50._0_8_ = sender.send_queue_size;
    local_50._8_8_ = (uv_loop_t *)0x0;
    if (sender.send_queue_size != 0) goto LAB_00185c14;
    local_50._0_8_ = recver.send_queue_size;
    local_50._8_8_ = (uv_loop_t *)0x0;
    if (recver.send_queue_size != 0) goto LAB_00185c23;
    printf("%d allocs for %d recvs\n",(ulong)(uint)alloc_cb_called);
    iVar7 = uv_udp_using_recvmmsg(&recver);
    if (iVar7 != 0) {
      local_50._0_8_ = SEXT48(alloc_cb_called);
      local_50._8_8_ = (uv_loop_t *)0x2;
      if ((uv_loop_t *)local_50._0_8_ != (uv_loop_t *)0x2) {
        run_test_udp_mmsg_cold_13();
        goto LAB_00185b0c;
      }
LAB_00185b34:
      puVar9 = uv_default_loop();
      uv_walk(puVar9,close_walk_cb,(void *)0x0);
      uv_run(puVar9,UV_RUN_DEFAULT);
      puVar9 = uv_default_loop();
      iVar7 = uv_loop_close(puVar9);
      if (iVar7 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00185c32;
    }
LAB_00185b0c:
    local_50._0_8_ = SEXT48(alloc_cb_called);
    local_50._8_8_ = SEXT48(recv_cb_called);
    if (local_50._0_8_ == local_50._8_8_) goto LAB_00185b34;
  }
  else {
LAB_00185b8d:
    run_test_udp_mmsg_cold_1();
LAB_00185b9c:
    run_test_udp_mmsg_cold_2();
LAB_00185bab:
    run_test_udp_mmsg_cold_3();
LAB_00185bba:
    run_test_udp_mmsg_cold_4();
LAB_00185bc9:
    run_test_udp_mmsg_cold_5();
LAB_00185bd8:
    run_test_udp_mmsg_cold_6();
LAB_00185be7:
    run_test_udp_mmsg_cold_8();
LAB_00185bf6:
    run_test_udp_mmsg_cold_9();
LAB_00185c05:
    run_test_udp_mmsg_cold_10();
LAB_00185c14:
    run_test_udp_mmsg_cold_11();
LAB_00185c23:
    run_test_udp_mmsg_cold_12();
LAB_00185c32:
    run_test_udp_mmsg_cold_15();
  }
  handle = (uv_udp_t *)local_50;
  puVar12 = (uv_udp_t *)(local_50 + 8);
  run_test_udp_mmsg_cold_14();
  lVar11 = CONCAT71(0x5789,handle == &sender || handle == &recver);
  if (handle == &sender || handle == &recver) {
    iVar7 = uv_udp_using_recvmmsg(handle);
    unaff_R14 = (uv_udp_t *)0x40000;
    if (iVar7 == 0) {
      unaff_R14 = (uv_udp_t *)0x10000;
    }
    handle = unaff_R14;
    pvVar10 = malloc((size_t)unaff_R14);
    *extraout_RDX = pvVar10;
    if (pvVar10 != (void *)0x0) {
      extraout_RDX[1] = unaff_R14;
      alloc_cb_called = alloc_cb_called + 1;
      return (int)pvVar10;
    }
  }
  else {
    alloc_cb_cold_1();
  }
  alloc_cb_cold_2();
  if ((long)puVar12 < 0) {
    recv_cb_cold_5();
LAB_00185dc3:
    recv_cb_cold_3();
    puVar12 = unaff_R14;
LAB_00185dd2:
    recv_cb_cold_1();
LAB_00185de1:
    recv_cb_cold_4();
  }
  else {
    if ((in_R8 & 0x10) == 0) {
      unaff_R14 = puVar12;
      if (puVar12 != (uv_udp_t *)0x4) goto LAB_00185dc3;
      if (lVar11 != 0) {
        unaff_R13 = (void *)*extraout_RDX_00;
        unaff_R12 = "PING";
        iVar7 = bcmp("PING",unaff_R13,4);
        if (iVar7 == 0) {
          iVar7 = recv_cb_called + 1;
          recv_cb_called = iVar7;
          if (iVar7 == 8) {
            uv_close((uv_handle_t *)handle,close_cb);
            uv_close((uv_handle_t *)&sender,close_cb);
            iVar7 = extraout_EAX;
          }
          if ((in_R8 & 8) != 0) {
            return iVar7;
          }
          goto LAB_00185d9e;
        }
        goto LAB_00185dee;
      }
      goto LAB_00185de1;
    }
    if (puVar12 != (uv_udp_t *)0x0) goto LAB_00185dd2;
    if (lVar11 == 0) {
LAB_00185d9e:
      free((void *)*extraout_RDX_00);
      return extraout_EAX_00;
    }
  }
  recv_cb_cold_2();
LAB_00185dee:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%.*s %s %.*s)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-mmsg.c"
          ,0x57,"\"PING\"","==","rcvbuf->base",puVar12,unaff_R12,"==",puVar12,unaff_R13);
  abort();
}

Assistant:

TEST_IMPL(udp_mmsg) {
  struct sockaddr_in addr;
  uv_buf_t buf;
  int i;

  ASSERT_EQ(0, uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  ASSERT_EQ(0, uv_udp_init_ex(uv_default_loop(), &recver,
                              AF_UNSPEC | UV_UDP_RECVMMSG));

  ASSERT_EQ(0, uv_udp_bind(&recver, (const struct sockaddr*) &addr, 0));

  ASSERT_EQ(0, uv_udp_recv_start(&recver, alloc_cb, recv_cb));

  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT_EQ(0, uv_udp_init(uv_default_loop(), &sender));

  buf = uv_buf_init("PING", 4);
  for (i = 0; i < NUM_SENDS; i++) {
    ASSERT_EQ(4, uv_udp_try_send(&sender, &buf, 1, (const struct sockaddr*) &addr));
  }

  ASSERT_EQ(0, uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(close_cb_called, 2);
  ASSERT_EQ(recv_cb_called, NUM_SENDS);

  ASSERT_EQ(sender.send_queue_size, 0);
  ASSERT_EQ(recver.send_queue_size, 0);

  printf("%d allocs for %d recvs\n", alloc_cb_called, recv_cb_called);

  /* On platforms that don't support mmsg, each recv gets its own alloc */
  if (uv_udp_using_recvmmsg(&recver))
    ASSERT_EQ(alloc_cb_called, EXPECTED_MMSG_ALLOCS);
  else
    ASSERT_EQ(alloc_cb_called, recv_cb_called);

  MAKE_VALGRIND_HAPPY();
  return 0;
}